

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

fio_protocol_s *
http1_new(uintptr_t uuid,http_settings_s *settings,void *unread_data,size_t unread_length)

{
  uint8_t uVar1;
  size_t sVar2;
  http_fio_protocol_s *owner;
  int *piVar3;
  
  if (unread_data == (void *)0x0 || unread_length < 0x2001) {
    owner = (http_fio_protocol_s *)fio_malloc(0x2108);
    if (owner == (http_fio_protocol_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http1.c:801"
                      );
      }
      kill(0,2);
      piVar3 = __errno_location();
      exit(*piVar3);
    }
    sVar2 = settings->max_header_size;
    uVar1 = settings->is_client;
    (owner->protocol).on_data = http1_on_data_first_time;
    (owner->protocol).on_ready = http1_on_ready;
    (owner->protocol).on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    (owner->protocol).on_close = http1_on_close;
    (owner->protocol).ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    (owner->protocol).rsv = 0;
    owner->uuid = uuid;
    owner->settings = settings;
    memset(owner + 1,0,0xb0);
    owner[3].uuid = sVar2;
    owner[3].settings = (http_settings_s *)0x0;
    *(undefined1 *)&owner[4].protocol.on_data = 0;
    *(uint8_t *)((long)&owner[4].protocol.on_data + 1) = uVar1;
    *(undefined4 *)((long)&owner[4].protocol.on_data + 2) = 0;
    *(undefined2 *)((long)&owner[4].protocol.on_data + 6) = 0;
    http_s_new((http_s *)&owner[1].protocol.rsv,owner,&HTTP1_VTABLE);
    if (unread_length < 0x2001 && unread_data != (void *)0x0) {
      memcpy((void *)((long)&owner[4].protocol.on_data + 3),unread_data,unread_length);
      owner[3].protocol.rsv = unread_length;
      fio_attach(uuid,(fio_protocol_s *)owner);
      fio_force_event(uuid,FIO_EVENT_ON_DATA);
    }
    else {
      fio_attach(uuid,(fio_protocol_s *)owner);
    }
  }
  else {
    owner = (http_fio_protocol_s *)0x0;
  }
  return &owner->protocol;
}

Assistant:

fio_protocol_s *http1_new(uintptr_t uuid, http_settings_s *settings,
                          void *unread_data, size_t unread_length) {
  if (unread_data && unread_length > HTTP_MAX_HEADER_LENGTH)
    return NULL;
  http1pr_s *p = fio_malloc(sizeof(*p) + HTTP_MAX_HEADER_LENGTH);
  // FIO_LOG_DEBUG("Allocated HTTP/1.1 protocol at. %p", (void *)p);
  FIO_ASSERT_ALLOC(p);
  *p = (http1pr_s){
      .p.protocol =
          {
              .on_data = http1_on_data_first_time,
              .on_close = http1_on_close,
              .on_ready = http1_on_ready,
          },
      .p.uuid = uuid,
      .p.settings = settings,
      .max_header_size = settings->max_header_size,
      .is_client = settings->is_client,
  };
  http_s_new(&p->request, &p->p, &HTTP1_VTABLE);
  if (unread_data && unread_length <= HTTP_MAX_HEADER_LENGTH) {
    memcpy(p->buf, unread_data, unread_length);
    p->buf_len = unread_length;
  }
  fio_attach(uuid, &p->p.protocol);
  if (unread_data && unread_length <= HTTP_MAX_HEADER_LENGTH) {
    fio_force_event(uuid, FIO_EVENT_ON_DATA);
  }
  return &p->p.protocol;
}